

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

void __thiscall GGSock::FileServer::Impl::Impl(Impl *this)

{
  Parameters *in_RDI;
  undefined1 in_stack_ffffffffffffffef;
  
  Parameters::Parameters(in_RDI);
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffef);
  *(undefined1 *)((long)&in_RDI[1].nWorkerThreads + 1) = 0;
  in_RDI[1].nMaxClients = 0;
  in_RDI[1].nMaxFiles = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x137318);
  std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::vector
            ((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_> *)
             0x137326);
  std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::vector
            ((vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> *)0x137334);
  *(undefined1 *)&in_RDI[6].nWorkerThreads = 0;
  std::
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::map((map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
         *)0x137349);
  *(undefined1 *)&in_RDI[8].listenPort = 0;
  std::
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::map((map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
         *)0x137361);
  std::mutex::mutex((mutex *)0x137372);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x137383);
  return;
}

Assistant:

bool updateFileInfos() {
        fileInfos.clear();

        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }
            const auto & file = files[i];
            fileInfos[i] = file.info;
        }

        return true;
    }